

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amha_star.hpp
# Opt level: O0

bool __thiscall
csbpl_planner::AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>::
expand(AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double> *this,
      SearchVertexPtr *vertex)

{
  double dVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  element_type *peVar5;
  __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var6;
  reference pvVar7;
  reference pvVar8;
  element_type *peVar9;
  element_type *peVar10;
  __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var11;
  double dVar12;
  double dVar13;
  shared_ptr<csbpl_common::Heap<double>::Element> local_160;
  shared_ptr<csbpl_common::Heap<double>::Element> local_150;
  shared_ptr<csbpl_common::Heap<double>::Element> local_140;
  double local_130;
  double f_cost_inad;
  _Node_iterator_base<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_true>
  _Stack_120;
  int i_2;
  _Node_iterator_base<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_true>
  local_118;
  shared_ptr<csbpl_common::Heap<double>::Element> local_110;
  shared_ptr<csbpl_common::Heap<double>::Element> local_100;
  shared_ptr<csbpl_common::Heap<double>::Element> local_f0;
  double local_e0;
  double f_cost_ad;
  _Node_iterator_base<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_true>
  local_d0;
  double local_c8;
  double new_cost;
  SearchVertexPtr vertex_copy;
  int i_1;
  SearchVertexPtr *successor;
  iterator __end0;
  iterator __begin0;
  vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
  *__range2;
  vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
  vertex_successors;
  shared_ptr<csbpl_common::Heap<double>::Element> local_60;
  int local_4c;
  undefined1 local_48 [4];
  int i;
  shared_ptr<csbpl_common::Heap<double>::Element> local_28;
  __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_18;
  SearchVertexPtr *vertex_local;
  AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double> *this_local;
  
  local_18 = (__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)vertex;
  vertex_local = (SearchVertexPtr *)this;
  peVar5 = std::
           __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)vertex);
  if ((peVar5->super_Element).heap_index_ != -1) {
    std::shared_ptr<csbpl_common::Heap<double>::Element>::
    shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
              (&local_28,
               (shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_> *)
               local_18);
    dVar12 = std::numeric_limits<double>::infinity();
    csbpl_common::Heap<double>::decreaseKey
              (&(this->
                super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                ).open_,&local_28,-dVar12);
    std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr(&local_28);
    csbpl_common::Heap<double>::remove
              ((Heap<double> *)local_48,
               (char *)&(this->
                        super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                        ).open_);
    std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr
              ((shared_ptr<csbpl_common::Heap<double>::Element> *)local_48);
    dVar12 = std::numeric_limits<double>::infinity();
    peVar5 = std::
             __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_18);
    (peVar5->super_Element).key_ = dVar12;
  }
  for (local_4c = 0;
      local_4c <
      (this->
      super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>).
      params_.num_inad_; local_4c = local_4c + 1) {
    peVar5 = std::
             __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_18);
    p_Var6 = (__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::
                vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                ::operator[](&peVar5->mha_copy_,(long)local_4c);
    peVar5 = std::
             __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var6);
    if ((peVar5->super_Element).heap_index_ != -1) {
      pvVar7 = std::vector<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
               ::operator[](&this->open_inad_,(long)local_4c);
      peVar5 = std::
               __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_18);
      pvVar8 = std::
               vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
               ::operator[](&peVar5->mha_copy_,(long)local_4c);
      std::shared_ptr<csbpl_common::Heap<double>::Element>::
      shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
                (&local_60,pvVar8);
      dVar12 = std::numeric_limits<double>::infinity();
      csbpl_common::Heap<double>::decreaseKey(pvVar7,&local_60,-dVar12);
      std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr(&local_60);
      pvVar7 = std::vector<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
               ::operator[](&this->open_inad_,(long)local_4c);
      csbpl_common::Heap<double>::remove
                ((Heap<double> *)
                 &vertex_successors.
                  super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(char *)pvVar7);
      std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr
                ((shared_ptr<csbpl_common::Heap<double>::Element> *)
                 &vertex_successors.
                  super__Vector_base<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      dVar12 = std::numeric_limits<double>::infinity();
      peVar5 = std::
               __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_18);
      p_Var6 = (__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)std::
                  vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                  ::operator[](&peVar5->mha_copy_,(long)local_4c);
      peVar5 = std::
               __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var6);
      (peVar5->super_Element).key_ = dVar12;
    }
  }
  peVar9 = std::
           __shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->
                            super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                            ).env_ptr_);
  sliding_puzzle::SlidingPuzzle::getValidSuccessors
            ((vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
              *)&__range2,peVar9,(SearchVertexPtr *)local_18);
  __end0 = std::
           vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
           ::begin((vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                    *)&__range2);
  successor = (SearchVertexPtr *)
              std::
              vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
              ::end((vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                     *)&__range2);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_*,_std::vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>_>
                                     *)&successor), bVar3) {
    p_Var6 = (__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)__gnu_cxx::
                __normal_iterator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_*,_std::vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>_>
                ::operator*(&__end0);
    peVar5 = std::
             __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var6);
    bVar3 = std::
            vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
            ::empty(&peVar5->mha_copy_);
    if (bVar3) {
      for (vertex_copy.
           super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi._4_4_ = 0;
          vertex_copy.
          super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi._4_4_ <
          (this->
          super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>)
          .params_.num_inad_;
          vertex_copy.
          super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi._4_4_ =
               vertex_copy.
               super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi._4_4_ + 1) {
        std::
        __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->(p_Var6);
        std::
        make_shared<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,std::shared_ptr<sliding_puzzle::SlidingPuzzleState>&>
                  ((shared_ptr<sliding_puzzle::SlidingPuzzleState> *)&new_cost);
        peVar5 = std::
                 __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var6);
        std::
        vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
        ::push_back(&peVar5->mha_copy_,(value_type *)&new_cost);
        peVar5 = std::
                 __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var6);
        p_Var11 = (__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::
                     vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                     ::operator[](&peVar5->mha_copy_,
                                  (long)vertex_copy.
                                        super___shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi._4_4_);
        peVar5 = std::
                 __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var11);
        std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::
        operator=(&peVar5->self_ptr_,
                  (shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_> *)
                  p_Var6);
        std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::
        ~shared_ptr((shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>
                     *)&new_cost);
      }
    }
    peVar5 = std::
             __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_18);
    dVar12 = peVar5->g_cost_;
    peVar9 = std::
             __shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->
                              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                              ).env_ptr_);
    peVar5 = std::
             __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_18);
    peVar10 = std::
              __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(p_Var6);
    iVar4 = sliding_puzzle::SlidingPuzzle::getCostToSuccessor
                      (peVar9,&peVar5->state_,&peVar10->state_);
    dVar12 = dVar12 + (double)iVar4;
    local_c8 = dVar12;
    peVar5 = std::
             __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var6);
    dVar1 = local_c8;
    if (dVar12 < peVar5->g_cost_) {
      peVar5 = std::
               __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var6);
      p_Var11 = local_18;
      peVar5->g_cost_ = dVar1;
      peVar5 = std::
               __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var6);
      std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>::operator=
                (&peVar5->parent_vertex_,
                 (shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_> *)
                 p_Var11);
      peVar5 = std::
               __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_18);
      iVar4 = peVar5->root_id_;
      peVar5 = std::
               __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var6);
      peVar5->root_id_ = iVar4;
      peVar5 = std::
               __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var6);
      peVar5 = std::
               __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar5->parent_vertex_);
      iVar4 = peVar5->depth_;
      peVar5 = std::
               __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var6);
      peVar5->depth_ = iVar4 + 1;
      peVar5 = std::
               __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var6);
      local_d0._M_cur =
           (__node_type *)
           std::
           unordered_map<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_sliding_puzzle::SlidingPuzzleState::Compare,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>_>
           ::find(&(this->
                   super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                   ).closed_,&peVar5->state_);
      f_cost_ad = (double)std::
                          unordered_map<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_sliding_puzzle::SlidingPuzzleState::Compare,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>_>
                          ::end(&(this->
                                 super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                 ).closed_);
      bVar3 = std::__detail::operator!=
                        (&local_d0,
                         (_Node_iterator_base<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>,_true>
                          *)&f_cost_ad);
      if (bVar3) {
        peVar5 = std::
                 __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var6);
        std::
        vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
        ::push_back(&this->incons_,&peVar5->state_);
        peVar5 = std::
                 __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var6);
        std::
        vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
        ::push_back(&this->incons_inad_,&peVar5->state_);
      }
      else {
        peVar5 = std::
                 __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var6);
        dVar12 = peVar5->g_cost_;
        dVar1 = (this->
                super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                ).params_.eps_;
        peVar9 = std::
                 __shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&(this->
                                  super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                  ).env_ptr_);
        peVar5 = std::
                 __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var6);
        dVar13 = sliding_puzzle::SlidingPuzzle::getAdmissibleHeuristicCost(peVar9,&peVar5->state_);
        local_e0 = dVar1 * dVar13 + dVar12;
        peVar5 = std::
                 __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var6);
        if ((peVar5->super_Element).heap_index_ == -1) {
          dVar12 = std::numeric_limits<double>::infinity();
          peVar5 = std::
                   __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(p_Var6);
          (peVar5->super_Element).key_ = dVar12;
          std::shared_ptr<csbpl_common::Heap<double>::Element>::
          shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
                    (&local_f0,
                     (shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>
                      *)p_Var6);
          csbpl_common::Heap<double>::insert
                    (&(this->
                      super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                      ).open_,&local_f0);
          std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr(&local_f0);
          std::shared_ptr<csbpl_common::Heap<double>::Element>::
          shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
                    (&local_100,
                     (shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>
                      *)p_Var6);
          csbpl_common::Heap<double>::decreaseKey
                    (&(this->
                      super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                      ).open_,&local_100,local_e0);
          std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr(&local_100);
        }
        else {
          dVar12 = std::numeric_limits<double>::infinity();
          peVar5 = std::
                   __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(p_Var6);
          (peVar5->super_Element).key_ = dVar12;
          std::shared_ptr<csbpl_common::Heap<double>::Element>::
          shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
                    (&local_110,
                     (shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>
                      *)p_Var6);
          csbpl_common::Heap<double>::decreaseKey
                    (&(this->
                      super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                      ).open_,&local_110,local_e0);
          std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr(&local_110);
        }
        peVar5 = std::
                 __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var6);
        local_118._M_cur =
             (__node_type *)
             std::
             unordered_map<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_sliding_puzzle::SlidingPuzzleState::Compare,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>_>
             ::find(&this->closed_inad_,&peVar5->state_);
        _Stack_120._M_cur =
             (__node_type *)
             std::
             unordered_map<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool,_std::hash<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>,_sliding_puzzle::SlidingPuzzleState::Compare,_std::allocator<std::pair<const_std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_bool>_>_>
             ::end(&this->closed_inad_);
        bVar3 = std::__detail::operator!=(&local_118,&stack0xfffffffffffffee0);
        if (bVar3) {
          peVar5 = std::
                   __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(p_Var6);
          std::
          vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>
          ::push_back(&this->incons_inad_,&peVar5->state_);
        }
        else {
          for (f_cost_inad._4_4_ = 0;
              f_cost_inad._4_4_ <
              (this->
              super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
              ).params_.num_inad_; f_cost_inad._4_4_ = f_cost_inad._4_4_ + 1) {
            peVar5 = std::
                     __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->(p_Var6);
            dVar12 = peVar5->g_cost_;
            dVar1 = (this->
                    super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                    ).params_.eps_;
            peVar9 = std::
                     __shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&(this->
                                      super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                                      ).env_ptr_);
            peVar5 = std::
                     __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->(p_Var6);
            dVar13 = sliding_puzzle::SlidingPuzzle::getInadmissibleHeuristicCost
                               (peVar9,&peVar5->state_,f_cost_inad._4_4_);
            local_130 = dVar1 * dVar13 + dVar12;
            if (local_130 <=
                (this->
                super_Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>
                ).params_.mha_eps_ * local_e0) {
              peVar5 = std::
                       __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->(p_Var6);
              p_Var11 = (__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)std::
                           vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                           ::operator[](&peVar5->mha_copy_,(long)f_cost_inad._4_4_);
              peVar5 = std::
                       __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->(p_Var11);
              if ((peVar5->super_Element).heap_index_ == -1) {
                dVar12 = std::numeric_limits<double>::infinity();
                peVar5 = std::
                         __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->(p_Var6);
                p_Var11 = (__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)std::
                             vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                             ::operator[](&peVar5->mha_copy_,(long)f_cost_inad._4_4_);
                peVar5 = std::
                         __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->(p_Var11);
                (peVar5->super_Element).key_ = dVar12;
                pvVar7 = std::
                         vector<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                         ::operator[](&this->open_inad_,(long)f_cost_inad._4_4_);
                peVar5 = std::
                         __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->(p_Var6);
                pvVar8 = std::
                         vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                         ::operator[](&peVar5->mha_copy_,(long)f_cost_inad._4_4_);
                std::shared_ptr<csbpl_common::Heap<double>::Element>::
                shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
                          (&local_140,pvVar8);
                csbpl_common::Heap<double>::insert(pvVar7,&local_140);
                std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr(&local_140);
                pvVar7 = std::
                         vector<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                         ::operator[](&this->open_inad_,(long)f_cost_inad._4_4_);
                peVar5 = std::
                         __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->(p_Var6);
                pvVar8 = std::
                         vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                         ::operator[](&peVar5->mha_copy_,(long)f_cost_inad._4_4_);
                std::shared_ptr<csbpl_common::Heap<double>::Element>::
                shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
                          (&local_150,pvVar8);
                csbpl_common::Heap<double>::decreaseKey(pvVar7,&local_150,local_130);
                std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr(&local_150);
              }
              else {
                dVar12 = std::numeric_limits<double>::infinity();
                peVar5 = std::
                         __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->(p_Var6);
                p_Var11 = (__shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)std::
                             vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                             ::operator[](&peVar5->mha_copy_,(long)f_cost_inad._4_4_);
                peVar5 = std::
                         __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->(p_Var11);
                (peVar5->super_Element).key_ = dVar12;
                pvVar7 = std::
                         vector<csbpl_common::Heap<double>,_std::allocator<csbpl_common::Heap<double>_>_>
                         ::operator[](&this->open_inad_,(long)f_cost_inad._4_4_);
                peVar5 = std::
                         __shared_ptr_access<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->(p_Var6);
                pvVar8 = std::
                         vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>
                         ::operator[](&peVar5->mha_copy_,(long)f_cost_inad._4_4_);
                std::shared_ptr<csbpl_common::Heap<double>::Element>::
                shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,double>,void>
                          (&local_160,pvVar8);
                csbpl_common::Heap<double>::decreaseKey(pvVar7,&local_160,local_130);
                std::shared_ptr<csbpl_common::Heap<double>::Element>::~shared_ptr(&local_160);
              }
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_*,_std::vector<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>,_std::allocator<std::shared_ptr<csbpl_planner::Vertex<sliding_puzzle::SlidingPuzzleState,_double>_>_>_>_>
    ::operator++(&__end0);
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

virtual bool expand(SearchVertexPtr& vertex)
    {
      if (vertex->heap_index_ != -1)
      {
        this->open_.decreaseKey(vertex,
                                -std::numeric_limits<double>::infinity());
        this->open_.remove();
        vertex->key_ = std::numeric_limits<double>::infinity();
      }
      
      for (int i=0; i<this->params_.num_inad_; ++i)
      {
        if (vertex->mha_copy_[i]->heap_index_ != -1)
        {
          open_inad_[i].decreaseKey(vertex->mha_copy_[i],
                                    -std::numeric_limits<double>::infinity());
          open_inad_[i].remove();
          vertex->mha_copy_[i]->key_ = std::numeric_limits<double>::infinity();
        }
      }
      
      std::vector<SearchVertexPtr> vertex_successors =
        this->env_ptr_->getValidSuccessors(vertex);
      
      for(const SearchVertexPtr &successor : vertex_successors)
      {
        if (successor->mha_copy_.empty())
        {
          for (int i=0; i<this->params_.num_inad_; ++i)
          {
            SearchVertexPtr vertex_copy = std::make_shared<SearchVertex>(successor->state_);
            successor->mha_copy_.push_back(vertex_copy);
            successor->mha_copy_[i]->self_ptr_ = successor;
          }
        }
        
        double new_cost = vertex->g_cost_ +
                          this->env_ptr_->getCostToSuccessor(vertex->state_,
                                                             successor->state_);
        
        if (new_cost < successor->g_cost_)
        {
          successor->g_cost_ = new_cost;
          successor->parent_vertex_ = vertex;
          successor->root_id_ = vertex->root_id_;
          successor->depth_ = successor->parent_vertex_->depth_ + 1;
          
          if (this->closed_.find(successor->state_) != this->closed_.end())
          {
            incons_.push_back(successor->state_);
            incons_inad_.push_back(successor->state_);
          }
          else
          {
            // Insert/Update in OPEN_0 with admissible heuristic
            double f_cost_ad = successor->g_cost_ +
                               this->params_.eps_*this->env_ptr_->getAdmissibleHeuristicCost(successor->state_);
            if (successor->heap_index_ == -1)
            {
              successor->key_ = std::numeric_limits<double>::infinity();
              this->open_.insert(successor);
              this->open_.decreaseKey(successor,
                                      f_cost_ad);
            }
            else
            {
              successor->key_ = std::numeric_limits<double>::infinity();
              this->open_.decreaseKey(successor,
                                      f_cost_ad);
            }
            
            if (closed_inad_.find(successor->state_) != closed_inad_.end())
            {
              incons_inad_.push_back(successor->state_);
            }
            else
            {
              for (int i=0; i<this->params_.num_inad_; ++i)
              {
                double f_cost_inad = successor->g_cost_ +
                                     this->params_.eps_*
                                     this->env_ptr_->getInadmissibleHeuristicCost(successor->state_, i);
                
                if (f_cost_inad <= this->params_.mha_eps_*f_cost_ad)
                {
                  if (successor->mha_copy_[i]->heap_index_ == -1)
                  {
                    successor->mha_copy_[i]->key_ = std::numeric_limits<double>::infinity();
                    open_inad_[i].insert(successor->mha_copy_[i]);
                    open_inad_[i].decreaseKey(successor->mha_copy_[i],
                                              f_cost_inad);
                  }
                  else
                  {
                    successor->mha_copy_[i]->key_ = std::numeric_limits<double>::infinity();
                    open_inad_[i].decreaseKey(successor->mha_copy_[i],
                                              f_cost_inad);
                  }
                }
              }
            }
          }
        }
      }
    }